

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.h
# Opt level: O1

void __thiscall gui::Widget::~Widget(Widget *this)

{
  _Atomic_word *p_Var1;
  pointer puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Widget_0027cc40;
  puVar2 = (this->name_).m_string._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)puVar2 != &(this->name_).m_string.field_2) {
    operator_delete(puVar2);
  }
  sf::Transformable::~Transformable(&this->transformable_);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
  ::~_Rb_tree(&(this->onFocusLost).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
  ::~_Rb_tree(&(this->onFocusGained).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
  ::~_Rb_tree(&(this->onMouseLeave).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*>_>_>_>
  ::~_Rb_tree(&(this->onMouseEnter).callbacks_._M_t);
  p_Var3 = (this->super_enable_shared_from_this<gui::Widget>)._M_weak_this.
           super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

virtual ~Widget() = default;